

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a4_aux.c
# Opt level: O1

void polygon(int vertices,int *points,ALLEGRO_COLOR color)

{
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 local_128 [16];
  undefined4 local_118;
  ALLEGRO_COLOR local_114;
  undefined4 local_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined8 local_f4;
  undefined8 uStack_ec;
  undefined4 uStack_e4;
  
  auVar4 = ZEXT816(0);
  local_118 = 0;
  if (0 < vertices) {
    uVar1 = 0;
    auVar3 = auVar4;
    do {
      auVar4._0_4_ = auVar3._0_4_ + (float)(int)*(undefined8 *)(points + uVar1 * 2);
      auVar4._4_4_ = auVar3._4_4_ + (float)(int)((ulong)*(undefined8 *)(points + uVar1 * 2) >> 0x20)
      ;
      auVar4._8_4_ = auVar3._8_4_ + 0.0;
      auVar4._12_4_ = auVar3._12_4_ + 0.0;
      uVar1 = uVar1 + 1;
      auVar3 = auVar4;
    } while ((uint)vertices != uVar1);
  }
  auVar3._4_4_ = (float)vertices;
  auVar3._0_4_ = (float)vertices;
  auVar3._8_8_ = 0;
  auVar4 = divps(auVar4,auVar3);
  local_128._8_8_ = 0;
  local_128._0_8_ = auVar4._0_8_;
  if (0 < vertices) {
    lVar2 = (long)&uStack_ec + 4;
    uVar1 = 0;
    do {
      *(ulong *)(lVar2 + -0x1c) =
           CONCAT44((float)(int)((ulong)*(undefined8 *)(points + uVar1 * 2) >> 0x20),
                    (float)(int)*(undefined8 *)(points + uVar1 * 2));
      *(undefined8 *)(lVar2 + -0x14) = 0;
      *(ALLEGRO_COLOR *)(lVar2 + -8) = color;
      *(undefined4 *)(lVar2 + -0xc) = 0;
      lVar2 = lVar2 + 0x24;
      uVar1 = uVar1 + 1;
    } while ((uint)vertices != uVar1);
  }
  lVar2 = (long)(vertices + 1);
  *(undefined4 *)((long)&local_114 + lVar2 * 0x24 + 0xc) = uStack_e4;
  local_114 = color;
  *(undefined8 *)(&local_118 + lVar2 * 9) = local_f4;
  *(undefined8 *)((long)&local_114 + lVar2 * 0x24 + 4) = uStack_ec;
  lVar2 = lVar2 * 0x24;
  *(undefined4 *)(local_128 + lVar2) = local_104;
  *(undefined4 *)(local_128 + lVar2 + 4) = uStack_100;
  *(undefined4 *)(local_128 + lVar2 + 8) = uStack_fc;
  *(undefined4 *)(local_128 + lVar2 + 0xc) = uStack_f8;
  al_draw_prim(local_128,0,0,0,vertices + 2,5);
  return;
}

Assistant:

void polygon(int vertices, const int *points, ALLEGRO_COLOR color)
{
   ALLEGRO_VERTEX vtxs[MAX_POLYGON_VERTICES + 2];
   int i;

   assert(vertices <= MAX_POLYGON_VERTICES);

   vtxs[0].x = 0.0;
   vtxs[0].y = 0.0;
   vtxs[0].z = 0.0;
   vtxs[0].color = color;
   vtxs[0].u = 0;
   vtxs[0].v = 0;

   for (i = 0; i < vertices; i++) {
      vtxs[0].x += points[i*2];
      vtxs[0].y += points[i*2 + 1];
   }

   vtxs[0].x /= vertices;
   vtxs[0].y /= vertices;

   for (i = 1; i <= vertices; i++) {
      vtxs[i].x = points[0];
      vtxs[i].y = points[1];
      vtxs[i].z = 0.0;
      vtxs[i].color = color;
      vtxs[i].u = 0;
      vtxs[i].v = 0;
      points += 2;
   }

   vtxs[vertices + 1] = vtxs[1];

   al_draw_prim(vtxs, NULL, NULL, 0, vertices + 2, ALLEGRO_PRIM_TRIANGLE_FAN);
}